

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall soplex::SPxSteepPR<double>::selectEnterX(SPxSteepPR<double> *this,double tol)

{
  SPxSolverBase<double> *pSVar1;
  double *pdVar2;
  DataKey DVar3;
  DataKey DVar4;
  double best;
  double bestCo;
  double local_38;
  double local_30;
  undefined4 local_28;
  uint uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  ::soplex::infinity::__tls_init();
  pdVar2 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_38 = *pdVar2;
  local_28 = SUB84(local_38,0);
  uStack_24 = (uint)((ulong)local_38 >> 0x20) ^ 0x80000000;
  uStack_20 = 0;
  uStack_1c = 0x80000000;
  local_38 = -local_38;
  ::soplex::infinity::__tls_init();
  local_30 = (double)CONCAT44(uStack_24,local_28);
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) goto LAB_002330b5;
      DVar3 = (DataKey)buildBestPriceVectorEnterDim(this,&local_38,tol);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      DVar3 = (DataKey)selectEnterHyperDim(this,&local_38,tol);
    }
    else {
LAB_002330b5:
      DVar3 = (DataKey)selectEnterDenseDim(this,&local_38,tol);
    }
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      if (pSVar1->sparsePricingEnterCo == true) {
        DVar4 = (DataKey)buildBestPriceVectorEnterCoDim(this,&local_30,tol);
        goto LAB_00233130;
      }
    }
    else if (pSVar1->sparsePricingEnterCo == true) {
      DVar4 = (DataKey)selectEnterHyperCoDim(this,&local_30,tol);
      goto LAB_00233130;
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      DVar3 = (DataKey)selectEnterSparseDim(this,&local_38,tol);
    }
    else {
      DVar3 = (DataKey)selectEnterDenseDim(this,&local_38,tol);
    }
    if ((((this->super_SPxPricer<double>).thesolver)->sparsePricingEnterCo == true) &&
       (this->refined == false)) {
      DVar4 = (DataKey)selectEnterSparseCoDim(this,&local_30,tol);
      goto LAB_00233130;
    }
  }
  DVar4 = (DataKey)selectEnterDenseCoDim(this,&local_30,tol);
LAB_00233130:
  if ((DVar3.info == 0) || ((local_38 <= local_30 * 0.8 && (((ulong)DVar4 & 0xffffffff) != 0)))) {
    DVar3 = DVar4;
  }
  return (SPxId)DVar3;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = R(-infinity);
   bestCo = R(-infinity);

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}